

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O1

void _lws_header_table_reset(allocated_headers *ah)

{
  ah->frag_index[0x4f] = '\0';
  ah->frag_index[0x50] = '\0';
  ah->frag_index[0x51] = '\0';
  ah->frag_index[0x52] = '\0';
  ah->frag_index[0x53] = '\0';
  ah->frag_index[0x54] = '\0';
  ah->frag_index[0x55] = '\0';
  ah->frag_index[0x56] = '\0';
  ah->frag_index[0x57] = '\0';
  ah->frag_index[0x58] = '\0';
  ah->frag_index[0x59] = '\0';
  ah->frag_index[0x5a] = '\0';
  ah->frag_index[0x5b] = '\0';
  ah->frag_index[0x5c] = '\0';
  ah->frag_index[0x5d] = '\0';
  ah->frag_index[0x5e] = '\0';
  ah->frag_index[0x40] = '\0';
  ah->frag_index[0x41] = '\0';
  ah->frag_index[0x42] = '\0';
  ah->frag_index[0x43] = '\0';
  ah->frag_index[0x44] = '\0';
  ah->frag_index[0x45] = '\0';
  ah->frag_index[0x46] = '\0';
  ah->frag_index[0x47] = '\0';
  ah->frag_index[0x48] = '\0';
  ah->frag_index[0x49] = '\0';
  ah->frag_index[0x4a] = '\0';
  ah->frag_index[0x4b] = '\0';
  ah->frag_index[0x4c] = '\0';
  ah->frag_index[0x4d] = '\0';
  ah->frag_index[0x4e] = '\0';
  ah->frag_index[0x4f] = '\0';
  ah->frag_index[0x30] = '\0';
  ah->frag_index[0x31] = '\0';
  ah->frag_index[0x32] = '\0';
  ah->frag_index[0x33] = '\0';
  ah->frag_index[0x34] = '\0';
  ah->frag_index[0x35] = '\0';
  ah->frag_index[0x36] = '\0';
  ah->frag_index[0x37] = '\0';
  ah->frag_index[0x38] = '\0';
  ah->frag_index[0x39] = '\0';
  ah->frag_index[0x3a] = '\0';
  ah->frag_index[0x3b] = '\0';
  ah->frag_index[0x3c] = '\0';
  ah->frag_index[0x3d] = '\0';
  ah->frag_index[0x3e] = '\0';
  ah->frag_index[0x3f] = '\0';
  ah->frag_index[0x20] = '\0';
  ah->frag_index[0x21] = '\0';
  ah->frag_index[0x22] = '\0';
  ah->frag_index[0x23] = '\0';
  ah->frag_index[0x24] = '\0';
  ah->frag_index[0x25] = '\0';
  ah->frag_index[0x26] = '\0';
  ah->frag_index[0x27] = '\0';
  ah->frag_index[0x28] = '\0';
  ah->frag_index[0x29] = '\0';
  ah->frag_index[0x2a] = '\0';
  ah->frag_index[0x2b] = '\0';
  ah->frag_index[0x2c] = '\0';
  ah->frag_index[0x2d] = '\0';
  ah->frag_index[0x2e] = '\0';
  ah->frag_index[0x2f] = '\0';
  ah->frag_index[0x10] = '\0';
  ah->frag_index[0x11] = '\0';
  ah->frag_index[0x12] = '\0';
  ah->frag_index[0x13] = '\0';
  ah->frag_index[0x14] = '\0';
  ah->frag_index[0x15] = '\0';
  ah->frag_index[0x16] = '\0';
  ah->frag_index[0x17] = '\0';
  ah->frag_index[0x18] = '\0';
  ah->frag_index[0x19] = '\0';
  ah->frag_index[0x1a] = '\0';
  ah->frag_index[0x1b] = '\0';
  ah->frag_index[0x1c] = '\0';
  ah->frag_index[0x1d] = '\0';
  ah->frag_index[0x1e] = '\0';
  ah->frag_index[0x1f] = '\0';
  ah->frag_index[0] = '\0';
  ah->frag_index[1] = '\0';
  ah->frag_index[2] = '\0';
  ah->frag_index[3] = '\0';
  ah->frag_index[4] = '\0';
  ah->frag_index[5] = '\0';
  ah->frag_index[6] = '\0';
  ah->frag_index[7] = '\0';
  ah->frag_index[8] = '\0';
  ah->frag_index[9] = '\0';
  ah->frag_index[10] = '\0';
  ah->frag_index[0xb] = '\0';
  ah->frag_index[0xc] = '\0';
  ah->frag_index[0xd] = '\0';
  ah->frag_index[0xe] = '\0';
  ah->frag_index[0xf] = '\0';
  memset(ah->frags,0,0x2f8);
  ah->nfrag = '\0';
  ah->pos = 0;
  ah->http_response = 0;
  ah->parser_state = '`';
  ah->lextable_pos = 0;
  ah->unk_pos = 0;
  ah->unk_ll_head = 0;
  ah->unk_ll_tail = 0;
  return;
}

Assistant:

void
__lws_header_table_reset(struct lws *wsi, int autoservice)
{
	struct allocated_headers *ah = wsi->http.ah;
	struct lws_context_per_thread *pt;
	struct lws_pollfd *pfd;

	/* if we have the idea we're resetting 'our' ah, must be bound to one */
	assert(ah);
	/* ah also concurs with ownership */
	assert(ah->wsi == wsi);

	_lws_header_table_reset(ah);

	/* since we will restart the ah, our new headers are not completed */
	wsi->hdr_parsing_completed = 0;

	/* while we hold the ah, keep a timeout on the wsi */
	__lws_set_timeout(wsi, PENDING_TIMEOUT_HOLDING_AH,
			  wsi->vhost->timeout_secs_ah_idle);

	time(&ah->assigned);

	if (wsi->position_in_fds_table != LWS_NO_FDS_POS &&
	    lws_buflist_next_segment_len(&wsi->buflist, NULL) &&
	    autoservice) {
		lwsl_debug("%s: service on readbuf ah\n", __func__);

		pt = &wsi->context->pt[(int)wsi->tsi];
		/*
		 * Unlike a normal connect, we have the headers already
		 * (or the first part of them anyway)
		 */
		pfd = &pt->fds[wsi->position_in_fds_table];
		pfd->revents |= LWS_POLLIN;
		lwsl_err("%s: calling service\n", __func__);
		lws_service_fd_tsi(wsi->context, pfd, wsi->tsi);
	}
}